

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mydefs.cpp
# Opt level: O2

void byebye(void)

{
  int __status;
  
  if (print_log_stats) {
    LASMessage(LAS_INFO,"Log stats: FE=%lu,E=%lu,SW=%lu,W=%lu,I=%lu",lasmessage_cnt[7],
               lasmessage_cnt[6],lasmessage_cnt[5],lasmessage_cnt[4],lasmessage_cnt[3]);
  }
  if (wait_on_exit == true) {
    fwrite("<press ENTER>\n",0xe,1,_stderr);
    getc(_stdin);
  }
  if (lasmessage_cnt[7] < 1) {
    if (lasmessage_cnt[6] < 1) {
      if (lasmessage_cnt[5] < 1) {
        exit((uint)(0 < lasmessage_cnt[4]));
      }
      __status = 2;
    }
    else {
      __status = 3;
    }
  }
  else {
    __status = 4;
  }
  exit(__status);
}

Assistant:

void byebye() {
  // optional: print stats
  if (print_log_stats) {
    LASMessage(
        LAS_INFO, "Log stats: FE=%lu,E=%lu,SW=%lu,W=%lu,I=%lu", lasmessage_cnt[LAS_FATAL_ERROR], lasmessage_cnt[LAS_ERROR],
        lasmessage_cnt[LAS_SERIOUS_WARNING], lasmessage_cnt[LAS_WARNING], lasmessage_cnt[LAS_INFO]);
  }
  if (wait_on_exit) {
    std::fprintf(stderr, "<press ENTER>\n");
    (void)std::getc(stdin);
  }
  //
  int code = 0;
  if (lasmessage_cnt[LAS_FATAL_ERROR] > 0) {
    code = 4;
  } else if (lasmessage_cnt[LAS_ERROR] > 0) {
    code = 3;
  } else if (lasmessage_cnt[LAS_SERIOUS_WARNING] > 0) {
    code = 2;
  } else if (lasmessage_cnt[LAS_WARNING] > 0) {
    code = 1;
  }
  exit(code);
}